

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<BindEntry>::cleanup(SmallVectorBase<BindEntry> *this,EVP_PKEY_CTX *ctx)

{
  pointer p;
  pointer p_00;
  pointer pBVar1;
  
  p_00 = this->data_;
  if (this->len != 0) {
    pBVar1 = p_00 + this->len;
    do {
      p = (p_00->path).entries.super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>.data_;
      if (p != (pointer)(p_00->path).entries.
                        super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>.firstElement) {
        operator_delete(p);
      }
      p_00 = p_00 + 1;
    } while (p_00 != pBVar1);
    p_00 = this->data_;
  }
  if (p_00 != (pointer)this->firstElement) {
    operator_delete(p_00);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }